

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O0

string * __thiscall
t_xsd_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_xsd_generator *this,t_type *ttype)

{
  uint uVar1;
  t_base tbase;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_40;
  t_base_type *local_20;
  t_type *ttype_local;
  t_xsd_generator *this_local;
  
  local_20 = (t_base_type *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_xsd_generator *)__return_storage_ptr__;
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[9])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[10])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xb])();
        if (((uVar1 & 1) == 0) &&
           (uVar1 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar1 & 1) == 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"container",&local_72);
          std::allocator<char>::~allocator((allocator<char> *)&local_72);
          return __return_storage_ptr__;
        }
        iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var_00,iVar2));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_70,"int",&local_71);
        xsd(__return_storage_ptr__,this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
    }
    else {
      tbase = t_base_type::get_base(local_20);
      base_type_name_abi_cxx11_(&local_40,this,tbase);
      xsd(__return_storage_ptr__,this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

string t_xsd_generator::type_name(t_type* ttype) {
  if (ttype->is_typedef()) {
    return ttype->get_name();
  }

  if (ttype->is_base_type()) {
    return xsd(base_type_name(((t_base_type*)ttype)->get_base()));
  }

  if (ttype->is_enum()) {
    return xsd("int");
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    return ttype->get_name();
  }

  return "container";
}